

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

bool CompareObject_String(PCASC_MAP pMap,char *szExistingString,char *szString,char *szStringEnd)

{
  char *szStringEnd_local;
  char *szString_local;
  char *szExistingString_local;
  PCASC_MAP pMap_local;
  
  szStringEnd_local = szString;
  szString_local = szExistingString;
  while( true ) {
    if (szStringEnd <= szStringEnd_local) {
      return true;
    }
    if (AsciiToUpperTable_BkSlash[*szString_local] != AsciiToUpperTable_BkSlash[*szStringEnd_local])
    break;
    szString_local = szString_local + 1;
    szStringEnd_local = szStringEnd_local + 1;
  }
  return false;
}

Assistant:

static bool CompareObject_String(
    PCASC_MAP pMap,
    const char * szExistingString,
    const char * szString,
    const char * szStringEnd)
{
    // Keep compiler happy
    CASCLIB_UNUSED(pMap);

    // Compare the whole part, case insensitive
    while(szString < szStringEnd)
    {
        if(AsciiToUpperTable_BkSlash[*szExistingString] != AsciiToUpperTable_BkSlash[*szString])
            return false;

        szExistingString++;
        szString++;
    }

    return true;
}